

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

return_type __thiscall
flatbuffers::Vector<keyfield::sample::Baz_const*,unsigned_int>::
LookupByKey<flatbuffers::Array<unsigned_char,(unsigned_short)4>*>
          (Vector<keyfield::sample::Baz_const*,unsigned_int> *this,
          Array<unsigned_char,_(unsigned_short)4> *key)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *element;
  void *search_result;
  Array<unsigned_char,_(unsigned_short)4> *key_local;
  Vector<const_keyfield::sample::Baz_*,_unsigned_int> *this_local;
  
  search_result = key;
  key_local = (Array<unsigned_char,_(unsigned_short)4> *)this;
  puVar2 = Vector<const_keyfield::sample::Baz_*,_unsigned_int>::Data
                     ((Vector<const_keyfield::sample::Baz_*,_unsigned_int> *)this);
  uVar1 = Vector<const_keyfield::sample::Baz_*,_unsigned_int>::size
                    ((Vector<const_keyfield::sample::Baz_*,_unsigned_int> *)this);
  puVar2 = (uint8_t *)
           bsearch(&search_result,puVar2,(ulong)uVar1,5,
                   KeyCompare<flatbuffers::Array<unsigned_char,(unsigned_short)4>*>);
  if (puVar2 == (uint8_t *)0x0) {
    this_local = (Vector<const_keyfield::sample::Baz_*,_unsigned_int> *)0x0;
  }
  else {
    this_local = (Vector<const_keyfield::sample::Baz_*,_unsigned_int> *)
                 IndirectHelper<const_keyfield::sample::Baz_*>::Read(puVar2,0);
  }
  return (return_type)this_local;
}

Assistant:

return_type LookupByKey(K key) const {
    void *search_result = std::bsearch(
        &key, Data(), size(), IndirectHelper<T>::element_stride, KeyCompare<K>);

    if (!search_result) {
      return nullptr;  // Key not found.
    }

    const uint8_t *element = reinterpret_cast<const uint8_t *>(search_result);

    return IndirectHelper<T>::Read(element, 0);
  }